

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpu_api_test.c
# Opt level: O0

int main(int argc,char **argv)

{
  VpuApiDemoCmdContext_t *cmd;
  VpuApiDemoCmdContext_t demoCmdCtx;
  RK_S32 ret;
  char **argv_local;
  int argc_local;
  
  demoCmdCtx.record_start_ms._4_4_ = 0;
  printf("/*******  vpu api demo in *******/\n");
  if (argc == 1) {
    show_usage();
    argv_local._4_4_ = 0;
  }
  else {
    vpuapi_hdl = (void *)dlopen("libvpu.so",0x101);
    if (vpuapi_hdl == (void *)0x0) {
      printf("failed to open libvpu.so\n");
      demoCmdCtx.record_start_ms._4_4_ = 0xffffffff;
    }
    else {
      vpuapi_open_ctx =
           (_func_RK_S32_VpuCodecContext_t_ptr_ptr *)dlsym(vpuapi_hdl,"vpu_open_context");
      vpuapi_close_ctx =
           (_func_RK_S32_VpuCodecContext_t_ptr_ptr *)dlsym(vpuapi_hdl,"vpu_close_context");
      vpuapi_mem_link = (_func_RK_S32_VPUMemLinear_t_ptr *)dlsym(vpuapi_hdl,"VPUMemLink");
      vpuapi_mem_free = (_func_RK_S32_VPUMemLinear_t_ptr *)dlsym(vpuapi_hdl,"VPUFreeLinear");
      if ((((vpuapi_open_ctx == (_func_RK_S32_VpuCodecContext_t_ptr_ptr *)0x0) ||
           (vpuapi_close_ctx == (_func_RK_S32_VpuCodecContext_t_ptr_ptr *)0x0)) ||
          (vpuapi_mem_link == (_func_RK_S32_VPUMemLinear_t_ptr *)0x0)) ||
         (vpuapi_mem_free == (_func_RK_S32_VPUMemLinear_t_ptr *)0x0)) {
        printf("failed to open vpu_open_context %p vpu_close_context %p\n",vpuapi_open_ctx,
               vpuapi_close_ctx);
        printf("failed to open VPUMemLink %p VPUFreeLinear %p\n",vpuapi_mem_link,vpuapi_mem_free);
        demoCmdCtx.record_start_ms._4_4_ = 0xffffffff;
      }
      else {
        printf("get vpuapi handle %p vpu_open_context %p vpu_close_context %p\n",vpuapi_hdl,
               vpuapi_open_ctx,vpuapi_close_ctx);
        memset((VpuApiDemoCmdContext_t *)&cmd,0,0x1b0);
        demoCmdCtx.width = 1;
        demoCmdCtx.record_start_ms._4_4_ = parse_options(argc,argv,(VpuApiDemoCmdContext_t *)&cmd);
        if (demoCmdCtx.record_start_ms._4_4_ == 0) {
          if (demoCmdCtx.width == 1) {
            demoCmdCtx.record_start_ms._4_4_ = vpu_decode_demo((VpuApiDemoCmdContext_t *)&cmd);
          }
          else if (demoCmdCtx.width == 2) {
            demoCmdCtx.record_start_ms._4_4_ = vpu_encode_demo((VpuApiDemoCmdContext_t *)&cmd);
          }
          else {
            demoCmdCtx.record_start_ms._4_4_ = 0xffffff9b;
          }
        }
        else {
          if (demoCmdCtx.record_start_ms._4_4_ == 1) {
            return 0;
          }
          printf("parse_options fail\n\n");
          show_usage();
          demoCmdCtx.record_start_ms._4_4_ = 0xffffff9b;
        }
      }
    }
    if (demoCmdCtx.record_start_ms._4_4_ == 0) {
      printf("vpu api demo complete OK.\n");
    }
    else {
      printf("vpu api demo fail, err: %d\n",(ulong)demoCmdCtx.record_start_ms._4_4_);
      if (vpuapi_hdl != (void *)0x0) {
        dlclose(vpuapi_hdl);
        vpuapi_hdl = (void *)0x0;
      }
    }
    argv_local._4_4_ = demoCmdCtx.record_start_ms._4_4_;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char **argv)
{
    RK_S32 ret = 0;
    VpuApiDemoCmdContext_t demoCmdCtx;
    VpuApiDemoCmdContext_t *cmd = NULL;

    printf("/*******  vpu api demo in *******/\n");
    if (argc == 1) {
        show_usage();
        return 0;
    }

    /* open library for access */
    vpuapi_hdl = dlopen("libvpu.so", RTLD_LAZY | RTLD_GLOBAL);
    if (NULL == vpuapi_hdl) {
        printf("failed to open libvpu.so\n");
        ret = -1;
        goto DEMO_OUT;
    }

    vpuapi_open_ctx = (RK_S32 (*)(VpuCodecContext_t **ctx))dlsym(vpuapi_hdl, "vpu_open_context");
    vpuapi_close_ctx = (RK_S32 (*)(VpuCodecContext_t **ctx))dlsym(vpuapi_hdl, "vpu_close_context");
    vpuapi_mem_link = (RK_S32 (*)(VPUMemLinear_t * p))dlsym(vpuapi_hdl, "VPUMemLink");
    vpuapi_mem_free = (RK_S32 (*)(VPUMemLinear_t * p))dlsym(vpuapi_hdl, "VPUFreeLinear");

    if (NULL == vpuapi_open_ctx || NULL == vpuapi_close_ctx ||
        NULL == vpuapi_mem_link || NULL == vpuapi_mem_free) {
        printf("failed to open vpu_open_context %p vpu_close_context %p\n",
               vpuapi_open_ctx, vpuapi_close_ctx);
        printf("failed to open VPUMemLink %p VPUFreeLinear %p\n",
               vpuapi_mem_link, vpuapi_mem_free);
        ret = -1;
        goto DEMO_OUT;
    }

    printf("get vpuapi handle %p vpu_open_context %p vpu_close_context %p\n",
           vpuapi_hdl, vpuapi_open_ctx, vpuapi_close_ctx);

    cmd = &demoCmdCtx;
    memset(cmd, 0, sizeof(VpuApiDemoCmdContext_t));
    cmd->codec_type = CODEC_DECODER;
    if ((ret = parse_options(argc, argv, cmd)) != 0) {
        if (ret == VPU_DEMO_PARSE_HELP_OK) {
            return 0;
        }

        printf("parse_options fail\n\n");
        show_usage();
        DEMO_ERR_RET(ERROR_INVALID_PARAM);
    }

    switch (cmd->codec_type) {
    case CODEC_DECODER : {
        ret = vpu_decode_demo(cmd);
    } break;
    case CODEC_ENCODER : {
        ret = vpu_encode_demo(cmd);
    } break;
    default : {
        ret = ERROR_INVALID_PARAM;
    } break;
    }

DEMO_OUT:
    if (ret) {
        printf("vpu api demo fail, err: %d\n", ret);
        if (vpuapi_hdl) {
            dlclose(vpuapi_hdl);
            vpuapi_hdl = NULL;
        }
    } else {
        printf("vpu api demo complete OK.\n");
    }
    return ret;
}